

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

void __thiscall
pbrt::SurfaceInteraction::SkipIntersection(SurfaceInteraction *this,RayDifferential *ray,Float t)

{
  undefined8 uVar1;
  undefined1 auVar6 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  Point3<float> PVar8;
  RayDifferential local_78;
  
  Interaction::SpawnRay(&local_78,&this->super_Interaction,&(ray->super_Ray).d);
  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       local_78.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       local_78.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
  *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       local_78.super_Ray._20_8_;
  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
       local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
  *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       CONCAT44(local_78.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z);
  (ray->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (uintptr_t)
          local_78.super_Ray.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  if (ray->hasDifferentials == true) {
    auVar6 = (undefined1  [56])0x0;
    VVar7 = Tuple3<pbrt::Vector3,float>::operator*
                      ((Tuple3<pbrt::Vector3,float> *)&ray->rxDirection,t);
    local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar2._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar2._8_56_ = auVar6;
    local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar2._0_16_);
    PVar8 = Point3<float>::operator+(&ray->rxOrigin,(Vector3<float> *)&local_78);
    auVar3._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar6;
    uVar1 = vmovlps_avx(auVar3._0_16_);
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    auVar6 = (undefined1  [56])0x0;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = PVar8.super_Tuple3<pbrt::Point3,_float>.z;
    VVar7 = Tuple3<pbrt::Vector3,float>::operator*
                      ((Tuple3<pbrt::Vector3,float> *)&ray->ryDirection,t);
    local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
         VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar6;
    local_78.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar4._0_16_);
    PVar8 = Point3<float>::operator+(&ray->ryOrigin,(Vector3<float> *)&local_78);
    auVar5._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    uVar1 = vmovlps_avx(auVar5._0_16_);
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = PVar8.super_Tuple3<pbrt::Point3,_float>.z;
  }
  return;
}

Assistant:

void SurfaceInteraction::SkipIntersection(RayDifferential *ray, Float t) const {
    *((Ray *)ray) = SpawnRay(ray->d);
    if (ray->hasDifferentials) {
        ray->rxOrigin = ray->rxOrigin + t * ray->rxDirection;
        ray->ryOrigin = ray->ryOrigin + t * ray->ryDirection;
    }
}